

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_file.c
# Opt level: O2

void file_handle_open(t_file_handle *x,t_symbol *file,t_symbol *smode)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  int *piVar4;
  char *pcVar5;
  uint uVar6;
  stat_conflict sb;
  
  if (-1 < x->x_fhptr->fh_fd) {
    pd_error(x,"\'open\' without prior \'close\'");
    return;
  }
  iVar3 = file_handle_getdefine(x);
  if (iVar3 != 0) {
    uVar6 = 0;
    if (smode != &s_ && smode != (t_symbol *)0x0) {
      cVar1 = *smode->s_name;
      if (cVar1 == 'a') {
        uVar6 = 0x401;
      }
      else if (cVar1 == 'c') {
        uVar6 = 0x201;
      }
      else {
        uVar6 = 0;
        if (cVar1 == 'w') {
          uVar6 = 1;
        }
      }
    }
    iVar3 = do_file_open(x,file->s_name,(uVar6 & 1) << 6 | uVar6);
    if (-1 < iVar3) {
      iVar3 = fstat(x->x_fhptr->fh_fd,(stat *)&sb);
      if (iVar3 == 0) {
        if ((sb.st_mode & 0xf000) != 0x4000) {
          x->x_fhptr->fh_mode = uVar6 & 1;
          return;
        }
        file_handle_close(x);
        if (x->x_verbose != 0) {
          pd_error(x,"unable to open directory \'%s\' as file",file->s_name);
        }
      }
      else {
        file_handle_close(x);
        if (x->x_verbose != 0) {
          pcVar2 = file->s_name;
          piVar4 = __errno_location();
          pcVar5 = strerror(*piVar4);
          pd_error(x,"unable to stat \'%s\': %s",pcVar2,pcVar5);
        }
      }
      outlet_bang(x->x_infoout);
    }
    return;
  }
  pd_error(x,"file handle: couldn\'t find file-define \'%s\'",x->x_fcname->s_name);
  return;
}

Assistant:

static void file_handle_open(t_file_handle*x, t_symbol*file, t_symbol*smode) {
    int mode = O_RDONLY;
    if (x->x_fd>=0) {
        pd_error(x, "'open' without prior 'close'");
        return;
    }
    if(!file_handle_getdefine(x)) {
        pd_error(x, "file handle: couldn't find file-define '%s'", x->x_fcname->s_name);
        return;
    }
    if(smode && smode!=&s_) {
        switch(smode->s_name[0]) {
        case 'r': /* read */
            mode = O_RDONLY;
            break;
        case 'w': /* write */
            mode = O_WRONLY;
            break;
        case 'a': /* append */
            mode = O_WRONLY | O_APPEND;
            break;
        case 'c': /* create */
            mode = O_WRONLY | O_TRUNC;
            break;
        }
    }
    if(mode & O_WRONLY) {
        mode |= O_CREAT;
    }
    if(do_file_open(x, file->s_name, mode)>=0) {
            /* check if we haven't accidentally opened a directory */
        struct stat sb;
        if(fstat(x->x_fd, &sb)) {
            file_handle_close(x);
            if(x->x_verbose)
                pd_error(x, "unable to stat '%s': %s", file->s_name, strerror(errno));
            outlet_bang(x->x_infoout);
            return;
        }
        if(S_ISDIR(sb.st_mode)) {
            file_handle_close(x);
            if(x->x_verbose)
                pd_error(x, "unable to open directory '%s' as file", file->s_name);
            outlet_bang(x->x_infoout);
            return;
        }
        x->x_mode = (mode&O_WRONLY)?1:0;
    }
}